

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O1

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,int16_t *short_t,size_t numElements)

{
  char **ppcVar1;
  size_t __n;
  ulong uVar2;
  NotEnoughMemoryException *this_00;
  char *pcVar3;
  char *pcVar4;
  undefined8 local_18;
  
  pcVar4 = (char *)&local_18;
  pcVar3 = (this->m_currentPosition).m_currentPosition;
  uVar2 = (ulong)((uint)(this->m_lastDataSize < 2) &
                 *(int *)&(this->m_alignPosition).m_currentPosition - (int)pcVar3);
  local_18 = short_t;
  if ((ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar3) <
      uVar2 + numElements * 2) {
    this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
    exception::NotEnoughMemoryException::NotEnoughMemoryException
              (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
    __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                exception::NotEnoughMemoryException::~NotEnoughMemoryException);
  }
  this->m_lastDataSize = 2;
  if (numElements != 0) {
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + uVar2;
  }
  __n = numElements * 2;
  if (this->m_swapBytes == true) {
    if (0 < (long)__n) {
      pcVar3 = (this->m_currentPosition).m_currentPosition + 1;
      do {
        (this->m_currentPosition).m_currentPosition = pcVar3;
        pcVar4[1] = pcVar3[-1];
        (this->m_currentPosition).m_currentPosition = pcVar3 + 1;
        *pcVar4 = *pcVar3;
        pcVar4 = pcVar4 + 2;
        pcVar3 = pcVar3 + 2;
      } while (pcVar4 < (char *)((long)&local_18 + __n));
    }
  }
  else {
    memcpy(short_t,(this->m_currentPosition).m_currentPosition,__n);
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + __n;
  }
  return this;
}

Assistant:

Cdr& Cdr::deserializeArray(int16_t *short_t, size_t numElements)
{
    size_t align = alignment(sizeof(*short_t));
    size_t totalSize = sizeof(*short_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if((m_lastPosition - m_currentPosition) >= sizeAligned)
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*short_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            char *dst = reinterpret_cast<char*>(&short_t);
            char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*short_t))
            {
                m_currentPosition++ >> dst[1];
                m_currentPosition++ >> dst[0];
            }
        }
        else
        {
            m_currentPosition.rmemcopy(short_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}